

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes-similarities.cc
# Opt level: O3

void __thiscall
dynet::L1Distance::backward_dev_impl<dynet::Device_CPU>
          (L1Distance *this,Device_CPU *dev,
          vector<const_dynet::Tensor_*,_std::allocator<const_dynet::Tensor_*>_> *xs,Tensor *fx,
          Tensor *dEdf,uint i,Tensor *dEdxi)

{
  pointer ppTVar1;
  Tensor *pTVar2;
  Tensor *pTVar3;
  float *pfVar4;
  float *pfVar5;
  ulong uVar6;
  ulong uVar7;
  int iVar8;
  array<long,_1> aVar9;
  _Type index;
  int iVar10;
  array<long,_1> aVar11;
  CoeffReturnType CVar12;
  XprType local_108;
  float *local_c0;
  array<long,_1> local_b8;
  DefaultDevice *local_b0;
  TensorEvaluator<const_Eigen::TensorCwiseBinaryOp<Eigen::internal::scalar_sum_op<float,_float>,_const_Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>,_const_Eigen::TensorCwiseUnaryOp<dynet::FL1Backward,_const_Eigen::TensorCwiseBinaryOp<Eigen::internal::scalar_difference_op<float,_float>,_const_Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>,_const_Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>_>_>_>,_Eigen::DefaultDevice>
  local_a8;
  
  ppTVar1 = (xs->super__Vector_base<const_dynet::Tensor_*,_std::allocator<const_dynet::Tensor_*>_>).
            _M_impl.super__Vector_impl_data._M_start;
  pTVar2 = ppTVar1[i];
  uVar6 = (ulong)(pTVar2->d).nd;
  iVar8 = 1;
  iVar10 = 1;
  if (uVar6 != 0) {
    iVar10 = 1;
    uVar7 = 0;
    do {
      iVar10 = iVar10 * (pTVar2->d).d[uVar7];
      uVar7 = uVar7 + 1;
    } while (uVar6 != uVar7);
  }
  aVar11._M_elems[0]._0_4_ = iVar10 * (pTVar2->d).bd;
  aVar11._M_elems[0]._4_4_ = 0;
  pTVar3 = ppTVar1[1 - i];
  uVar6 = (ulong)(pTVar3->d).nd;
  if (uVar6 != 0) {
    iVar8 = 1;
    uVar7 = 0;
    do {
      iVar8 = iVar8 * (pTVar3->d).d[uVar7];
      uVar7 = uVar7 + 1;
    } while (uVar6 != uVar7);
  }
  pfVar4 = pTVar2->v;
  pfVar5 = pTVar3->v;
  aVar9._M_elems[0]._0_4_ = iVar8 * (pTVar3->d).bd;
  aVar9._M_elems[0]._4_4_ = 0;
  local_108.m_rhs_xpr.m_functor.d = as_scalar(dEdf);
  local_108.m_lhs_xpr.m_data = dEdxi->v;
  uVar6 = (ulong)(dEdxi->d).nd;
  iVar8 = 1;
  if (uVar6 != 0) {
    uVar7 = 0;
    do {
      iVar8 = iVar8 * (dEdxi->d).d[uVar7];
      uVar7 = uVar7 + 1;
    } while (uVar6 != uVar7);
  }
  local_108.m_lhs_xpr.m_dimensions.super_array<long,_1>._M_elems[0]._0_4_ = iVar8 * (dEdxi->d).bd;
  local_108.m_lhs_xpr.m_dimensions.super_array<long,_1>._M_elems[0]._4_4_ = 0;
  local_b0 = dev->edevice;
  local_108.m_rhs_xpr.m_xpr.m_lhs_xpr.m_data = pfVar4;
  local_108.m_rhs_xpr.m_xpr.m_lhs_xpr.m_dimensions.super_array<long,_1>._M_elems[0] =
       (array<long,_1>)(array<long,_1>)aVar11._M_elems[0];
  local_108.m_rhs_xpr.m_xpr.m_rhs_xpr.m_data = pfVar5;
  local_108.m_rhs_xpr.m_xpr.m_rhs_xpr.m_dimensions.super_array<long,_1>._M_elems[0] =
       (array<long,_1>)(array<long,_1>)aVar9._M_elems[0];
  local_c0 = local_108.m_lhs_xpr.m_data;
  local_b8._M_elems[0] =
       (_Type)(_Type)local_108.m_lhs_xpr.m_dimensions.super_array<long,_1>._M_elems[0];
  Eigen::
  TensorEvaluator<const_Eigen::TensorCwiseBinaryOp<Eigen::internal::scalar_sum_op<float,_float>,_const_Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>,_const_Eigen::TensorCwiseUnaryOp<dynet::FL1Backward,_const_Eigen::TensorCwiseBinaryOp<Eigen::internal::scalar_difference_op<float,_float>,_const_Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>,_const_Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>_>_>_>,_Eigen::DefaultDevice>
  ::TensorEvaluator(&local_a8,&local_108,local_b0);
  aVar11._M_elems[0] = local_b8._M_elems[0];
  if ((array<long,_1>)local_b8._M_elems[0] ==
      local_a8.m_leftImpl.m_dims.super_array<long,_1>._M_elems[0]) {
    if (0 < (long)local_b8._M_elems[0]) {
      index[0] = 0;
      do {
        CVar12 = Eigen::
                 TensorEvaluator<const_Eigen::TensorCwiseBinaryOp<Eigen::internal::scalar_sum_op<float,_float>,_const_Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>,_const_Eigen::TensorCwiseUnaryOp<dynet::FL1Backward,_const_Eigen::TensorCwiseBinaryOp<Eigen::internal::scalar_difference_op<float,_float>,_const_Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>,_const_Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>_>_>_>,_Eigen::DefaultDevice>
                 ::coeff(&local_a8,index[0]);
        if (local_c0 == (float *)0x0) {
          __assert_fail("m_data != __null",
                        "/usr/include/eigen3/unsupported/Eigen/CXX11/src/Tensor/TensorEvaluator.h",
                        100,
                        "CoeffReturnType &Eigen::TensorEvaluator<Eigen::TensorMap<Eigen::Tensor<float, 1>>, Eigen::DefaultDevice>::coeffRef(Index) [Derived = Eigen::TensorMap<Eigen::Tensor<float, 1>>, Device = Eigen::DefaultDevice]"
                       );
        }
        local_c0[index[0]] = CVar12;
        index[0] = index[0] + 1;
      } while (aVar11._M_elems[0] != (_Type)index[0]);
    }
    return;
  }
  __assert_fail("dimensions_match(m_leftImpl.dimensions(), m_rightImpl.dimensions())",
                "/usr/include/eigen3/unsupported/Eigen/CXX11/src/Tensor/TensorAssign.h",0x92,
                "bool Eigen::TensorEvaluator<const Eigen::TensorAssignOp<Eigen::TensorMap<Eigen::Tensor<float, 1>>, const Eigen::TensorCwiseBinaryOp<Eigen::internal::scalar_sum_op<float>, const Eigen::TensorMap<Eigen::Tensor<float, 1>>, const Eigen::TensorCwiseUnaryOp<dynet::FL1Backward, const Eigen::TensorCwiseBinaryOp<Eigen::internal::scalar_difference_op<float>, const Eigen::TensorMap<Eigen::Tensor<float, 1>>, const Eigen::TensorMap<Eigen::Tensor<float, 1>>>>>>, Eigen::DefaultDevice>::evalSubExprsIfNeeded(EvaluatorPointerType) [Derived = const Eigen::TensorAssignOp<Eigen::TensorMap<Eigen::Tensor<float, 1>>, const Eigen::TensorCwiseBinaryOp<Eigen::internal::scalar_sum_op<float>, const Eigen::TensorMap<Eigen::Tensor<float, 1>>, const Eigen::TensorCwiseUnaryOp<dynet::FL1Backward, const Eigen::TensorCwiseBinaryOp<Eigen::internal::scalar_difference_op<float>, const Eigen::TensorMap<Eigen::Tensor<float, 1>>, const Eigen::TensorMap<Eigen::Tensor<float, 1>>>>>>, Device = Eigen::DefaultDevice]"
               );
}

Assistant:

void L1Distance::backward_dev_impl(const MyDevice & dev,
                             const vector<const Tensor*>& xs,
                             const Tensor& fx,
                             const Tensor& dEdf,
                             unsigned i,
                             Tensor& dEdxi) const {
  DYNET_ASSERT(i < 2, "Failed dimension check in L1Distance::backward");
  dEdxi.tvec().device(*dev.edevice) += (xs[i]->tvec() - xs[1-i]->tvec()).unaryExpr(FL1Backward(as_scalar(dEdf)));
}